

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createSubdivSphere
          (SceneGraph *this,Vec3fa *center,float radius,size_t N,float tessellationRate,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  pointer *ppuVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  pointer pvVar4;
  Vec3fa *ptr;
  iterator iVar5;
  undefined8 uVar6;
  SubdivMeshNode *this_00;
  Node *pNVar7;
  int iVar8;
  SubdivMeshNode *this_01;
  Vec3fa *pVVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  uint p11;
  uint p10;
  uint p00;
  uint p11_1;
  float phif;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  float local_b4;
  ulong local_b0;
  ulong local_a8;
  float local_9c;
  float local_98;
  float local_94;
  ulong local_90;
  int local_88;
  float local_84;
  size_t local_80;
  ulong local_78;
  SubdivMeshNode *local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_68;
  ulong local_60;
  Ref<embree::SceneGraph::MaterialNode> local_58;
  float local_4c;
  uint local_48;
  uint local_44;
  ulong local_40;
  Node *local_38;
  
  local_a8 = CONCAT44(local_a8._4_4_,tessellationRate);
  local_94 = radius;
  local_80 = N;
  this_01 = (SubdivMeshNode *)operator_new(0x1b0);
  local_58 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  local_70 = this_01;
  if (local_58.ptr != (MaterialNode *)0x0) {
    (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  SubdivMeshNode::SubdivMeshNode(this_01,&local_58,(BBox1f)0x3f80000000000000,1);
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
  local_38 = (Node *)this;
  if (local_58.ptr != (MaterialNode *)0x0) {
    (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  uVar11 = (int)local_80 * 2;
  local_b0 = (ulong)uVar11;
  this_01->tessellationRate = (float)local_a8;
  pvVar4 = (this_01->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar13 = (ulong)(((int)local_80 + 1) * uVar11);
  uVar16 = pvVar4->size_alloced;
  uVar12 = uVar16;
  if ((uVar16 < uVar13) && (uVar12 = uVar13, uVar16 != 0)) {
    while (uVar12 = uVar16, uVar12 < uVar13) {
      uVar16 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0);
    }
  }
  if (uVar13 < pvVar4->size_active) {
    pvVar4->size_active = uVar13;
  }
  if (pvVar4->size_alloced == uVar12) {
    pvVar4->size_active = uVar13;
  }
  else {
    ptr = pvVar4->items;
    pVVar9 = (Vec3fa *)alignedMalloc(uVar12 << 4,0x10);
    pvVar4->items = pVVar9;
    if (pvVar4->size_active != 0) {
      lVar14 = 0;
      uVar16 = 0;
      do {
        puVar2 = (undefined8 *)((long)&ptr->field_0 + lVar14);
        uVar6 = puVar2[1];
        puVar3 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar14);
        *puVar3 = *puVar2;
        puVar3[1] = uVar6;
        uVar16 = uVar16 + 1;
        lVar14 = lVar14 + 0x10;
      } while (uVar16 < pvVar4->size_active);
    }
    alignedFree(ptr);
    pvVar4->size_active = uVar13;
    pvVar4->size_alloced = uVar12;
  }
  uVar12 = local_b0 & 0xffffffff;
  fVar18 = (float)uVar12;
  auVar20 = rcpss(ZEXT416((uint)fVar18),ZEXT416((uint)fVar18));
  fVar19 = (float)(local_80 & 0xffffffff);
  local_84 = (2.0 - fVar18 * auVar20._0_4_) * auVar20._0_4_;
  auVar20 = rcpss(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19));
  local_4c = (2.0 - fVar19 * auVar20._0_4_) * auVar20._0_4_;
  iVar10 = (int)local_b0;
  local_60 = (ulong)(iVar10 - 1);
  local_68 = &local_70->verticesPerFace;
  local_70 = (SubdivMeshNode *)&local_70->position_indices;
  local_48 = iVar10 * (int)local_80;
  local_78 = (ulong)(uint)-iVar10;
  local_88 = 0;
  lVar14 = 0;
  uVar16 = 0;
  local_40 = local_78;
  do {
    local_90 = uVar16;
    if ((int)local_b0 != 0) {
      local_a8 = CONCAT44(local_a8._4_4_,(float)uVar16 * 3.1415927 * local_4c);
      uVar16 = 0;
      do {
        local_9c = ((float)(uVar16 & 0xffffffff) + (float)(uVar16 & 0xffffffff)) * 3.1415927 *
                   local_84;
        local_b4 = (center->field_0).m128[0];
        local_98 = sinf((float)local_a8);
        local_98 = local_98 * local_94;
        fVar18 = sinf(local_9c);
        uVar11 = (int)uVar16 + (int)lVar14;
        ((this_01->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar11].field_0.m128[0] =
             fVar18 * local_98 + local_b4;
        local_b4 = (center->field_0).m128[1];
        fVar18 = cosf((float)local_a8);
        ((this_01->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar11].field_0.m128[1] =
             fVar18 * local_94 + local_b4;
        local_b4 = (center->field_0).m128[2];
        local_98 = sinf((float)local_a8);
        local_98 = local_98 * local_94;
        fVar18 = cosf(local_9c);
        ((this_01->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar11].field_0.m128[2] =
             fVar18 * local_98 + local_b4;
        uVar16 = uVar16 + 1;
      } while (uVar12 != uVar16);
    }
    this_00 = local_70;
    if ((int)local_90 != 0) {
      if ((int)local_90 == 1) {
        if ((int)local_b0 != 0) {
          iVar10 = 1;
          do {
            local_bc = (uint)local_60;
            local_c0 = local_bc + iVar10;
            iVar8 = iVar10;
            if ((int)local_40 + iVar10 == 0) {
              iVar8 = 0;
            }
            local_c4 = iVar8 + (int)local_b0;
            local_b8 = 3;
            iVar5._M_current =
                 (this_01->verticesPerFace).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this_01->verticesPerFace).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(local_68,iVar5,&local_b8);
            }
            else {
              *iVar5._M_current = 3;
              ppuVar1 = &(this_01->verticesPerFace).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
            iVar5._M_current =
                 (this_01->position_indices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this_01->position_indices).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar5,
                         &local_c0);
            }
            else {
              *iVar5._M_current = local_c0;
              ppuVar1 = &(this_01->position_indices).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
            iVar5._M_current =
                 (this_01->position_indices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this_01->position_indices).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar5,
                         &local_bc);
            }
            else {
              *iVar5._M_current = local_bc;
              ppuVar1 = &(this_01->position_indices).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
            iVar5._M_current =
                 (this_01->position_indices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this_01->position_indices).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar5,
                         &local_c4);
            }
            else {
              *iVar5._M_current = local_c4;
              ppuVar1 = &(this_01->position_indices).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
            iVar8 = (int)local_40 + iVar10;
            iVar10 = iVar10 + 1;
          } while (iVar8 != 0);
        }
      }
      else if ((int)local_90 == (uint)local_80) {
        if ((int)local_b0 != 0) {
          local_a8 = CONCAT44(local_a8._4_4_,((int)local_90 + -1) * (int)local_b0);
          iVar10 = 0;
          do {
            local_bc = (int)local_78 + iVar10;
            bVar17 = (int)local_60 == iVar10;
            iVar10 = iVar10 + 1;
            iVar8 = iVar10;
            if (bVar17) {
              iVar8 = 0;
            }
            local_c0 = iVar8 + (int)(float)local_a8;
            local_c4 = local_48;
            local_b8 = 3;
            iVar5._M_current =
                 (this_01->verticesPerFace).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this_01->verticesPerFace).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(local_68,iVar5,&local_b8);
            }
            else {
              *iVar5._M_current = 3;
              ppuVar1 = &(this_01->verticesPerFace).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
            iVar5._M_current =
                 (this_01->position_indices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this_01->position_indices).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar5,
                         &local_c4);
            }
            else {
              *iVar5._M_current = local_c4;
              ppuVar1 = &(this_01->position_indices).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
            iVar5._M_current =
                 (this_01->position_indices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this_01->position_indices).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar5,
                         &local_bc);
            }
            else {
              *iVar5._M_current = local_bc;
              ppuVar1 = &(this_01->position_indices).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
            iVar5._M_current =
                 (this_01->position_indices).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this_01->position_indices).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar5,
                         &local_c0);
            }
            else {
              *iVar5._M_current = local_c0;
              ppuVar1 = &(this_01->position_indices).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
          } while ((int)local_b0 != iVar10);
        }
      }
      else if ((int)local_b0 != 0) {
        local_a8 = (ulong)(uint)(((int)local_90 + -1) * (int)local_b0);
        local_9c = (float)((int)local_90 * (int)local_b0);
        iVar10 = 0;
        do {
          iVar15 = iVar10 + 1;
          local_bc = (int)local_78 + iVar10;
          iVar8 = iVar15;
          if ((int)local_60 == iVar10) {
            iVar8 = 0;
          }
          local_c0 = (int)local_a8 + iVar8;
          local_c4 = iVar10 + local_88;
          local_b8 = iVar8 + (int)local_9c;
          local_44 = 4;
          iVar5._M_current =
               (this_01->verticesPerFace).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this_01->verticesPerFace).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(local_68,iVar5,&local_44);
          }
          else {
            *iVar5._M_current = 4;
            ppuVar1 = &(this_01->verticesPerFace).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
          iVar5._M_current =
               (this_01->position_indices).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this_01->position_indices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar5,&local_c4)
            ;
          }
          else {
            *iVar5._M_current = local_c4;
            ppuVar1 = &(this_01->position_indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
          iVar5._M_current =
               (this_01->position_indices).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this_01->position_indices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar5,&local_bc)
            ;
          }
          else {
            *iVar5._M_current = local_bc;
            ppuVar1 = &(this_01->position_indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
          iVar5._M_current =
               (this_01->position_indices).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this_01->position_indices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar5,&local_c0)
            ;
          }
          else {
            *iVar5._M_current = local_c0;
            ppuVar1 = &(this_01->position_indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
          iVar5._M_current =
               (this_01->position_indices).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this_01->position_indices).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar5,&local_b8)
            ;
          }
          else {
            *iVar5._M_current = local_b8;
            ppuVar1 = &(this_01->position_indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
          iVar10 = iVar15;
        } while ((int)local_b0 != iVar15);
      }
    }
    pNVar7 = local_38;
    uVar11 = (int)local_90 + 1;
    uVar16 = (ulong)uVar11;
    lVar14 = lVar14 + uVar12;
    local_78 = (ulong)(uint)((int)local_78 + (int)local_b0);
    local_88 = local_88 + (int)local_b0;
  } while (uVar11 <= (uint)local_80);
  (local_38->super_RefCount)._vptr_RefCount = (_func_int **)this_01;
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[3])(this_01);
  return (Ref<embree::SceneGraph::Node>)pNVar7;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createSubdivSphere (const Vec3fa& center, const float radius, size_t N, float tessellationRate, Ref<MaterialNode> material)
  {
    unsigned numPhi = unsigned(N);
    unsigned numTheta = 2*numPhi;
    unsigned numVertices = numTheta*(numPhi+1);
    Ref<SceneGraph::SubdivMeshNode> mesh = new SceneGraph::SubdivMeshNode(material,BBox1f(0,1),1);
    mesh->tessellationRate = tessellationRate;
    mesh->positions[0].resize(numVertices);

    /* create sphere geometry */
    const float rcpNumTheta = rcp((float)numTheta);
    const float rcpNumPhi   = rcp((float)numPhi);
    for (unsigned int phi=0; phi<=numPhi; phi++)
    {
      for (unsigned int theta=0; theta<numTheta; theta++)
      {
	const float phif   = phi*float(pi)*rcpNumPhi;
	const float thetaf = theta*2.0f*float(pi)*rcpNumTheta;
	mesh->positions[0][phi*numTheta+theta].x = center.x + radius*sin(phif)*sin(thetaf);
        mesh->positions[0][phi*numTheta+theta].y = center.y + radius*cos(phif);
	mesh->positions[0][phi*numTheta+theta].z = center.z + radius*sin(phif)*cos(thetaf);
      }
      if (phi == 0) continue;
      
      if (phi == 1)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = numTheta-1;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->verticesPerFace.push_back(3);
          mesh->position_indices.push_back(p10);
          mesh->position_indices.push_back(p00);
          mesh->position_indices.push_back(p11);
	}
      }
      else if (phi == numPhi)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = numPhi*numTheta;
          mesh->verticesPerFace.push_back(3);
          mesh->position_indices.push_back(p10);
          mesh->position_indices.push_back(p00);
          mesh->position_indices.push_back(p01);
	}
      }
      else
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->verticesPerFace.push_back(4);
          mesh->position_indices.push_back(p10);
          mesh->position_indices.push_back(p00);
          mesh->position_indices.push_back(p01);
          mesh->position_indices.push_back(p11);
	}
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }